

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O3

QList<QByteArray> * __thiscall
QTzTimeZonePrivate::availableTimeZoneIds
          (QList<QByteArray> *__return_storage_ptr__,QTzTimeZonePrivate *this)

{
  long lVar1;
  Type *this_00;
  iterator iVar2;
  iterator iVar3;
  ulong uVar4;
  
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>_>::operator->
                      ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_tzZones>_>
                        *)__return_storage_ptr__);
  QHash<QByteArray,_QTzTimeZone>::keys(__return_storage_ptr__,this_00);
  iVar2 = QList<QByteArray>::begin(__return_storage_ptr__);
  iVar3 = QList<QByteArray>::end(__return_storage_ptr__);
  if (iVar2.i != iVar3.i) {
    uVar4 = ((long)iVar3.i - (long)iVar2.i >> 3) * -0x5555555555555555;
    lVar1 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::__introsort_loop<QList<QByteArray>::iterator,long_long,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar2.i,iVar3.i,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<QList<QByteArray>::iterator,__gnu_cxx::__ops::_Iter_less_iter>
              (iVar2.i,iVar3.i);
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QByteArray> QTzTimeZonePrivate::availableTimeZoneIds() const
{
    QList<QByteArray> result = tzZones->keys();
    std::sort(result.begin(), result.end());
    return result;
}